

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator fmt::v5::
         format_to<char_const*,std::__cxx11::string,bidfx_public_api::price::provider::Provider::Status,std::__cxx11::string,500ul,char>
                   (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf,char **format_str,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   Status *args_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  char **buf_00;
  iterator iVar1;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::provider::Provider::Status,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  local_58;
  string_view local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  Status *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  char **format_str_local;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf_local;
  
  local_38 = args_2;
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = (Status *)args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)format_str;
  format_str_local = (char **)buf;
  internal::
  check_format_string<std::__cxx11::string,bidfx_public_api::price::provider::Provider::Status,std::__cxx11::string,char_const*>
            (format_str);
  buf_00 = format_str_local;
  basic_string_view<char>::basic_string_view(&local_48,*(char **)args_local);
  make_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::__cxx11::string,bidfx_public_api::price::provider::Provider::Status,std::__cxx11::string>
            (&local_88,(v5 *)args_local_1,args_local_2,(Status *)local_38,args_2);
  format_args::
  format_args<fmt::v5::format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,std::__cxx11::string,bidfx_public_api::price::provider::Provider::Status,std::__cxx11::string>>
            ((format_args *)&local_58,&local_88);
  iVar1 = vformat_to((buffer *)buf_00,local_48,(format_args)local_58);
  return (iterator)iVar1.container;
}

Assistant:

inline typename buffer_context<Char>::type::iterator format_to(
    basic_memory_buffer<Char, SIZE> &buf, const String &format_str,
    const Args & ... args) {
  internal::check_format_string<Args...>(format_str);
  return vformat_to(
        buf, basic_string_view<Char>(format_str),
        make_format_args<typename buffer_context<Char>::type>(args...));
}